

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_tcp_connection.cc
# Opt level: O0

void __thiscall AliTcpConnection::Close(AliTcpConnection *this)

{
  AliTcpConnection *this_local;
  
  if (this->fd_ != 0) {
    close(this->fd_);
  }
  if (this != (AliTcpConnection *)0x0) {
    ~AliTcpConnection(this);
    operator_delete(this,0x38);
  }
  return;
}

Assistant:

void AliTcpConnection::Close() {
  if(fd_) {
#ifdef WIN32
    closesocket(fd_);
#else
    ::close(fd_);
#endif
  }

  delete this;
  return;
}